

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlNodePtr nodePop(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlNodePtr pxVar2;
  long lVar3;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    iVar1 = ctxt->nodeNr;
    lVar3 = (long)iVar1;
    if (0 < lVar3) {
      ctxt->nodeNr = iVar1 + -1;
      if (iVar1 == 1) {
        pxVar2 = (xmlNodePtr)0x0;
      }
      else {
        pxVar2 = ctxt->nodeTab[lVar3 + -2];
      }
      ctxt->node = pxVar2;
      pxVar2 = ctxt->nodeTab[lVar3 + -1];
      ctxt->nodeTab[lVar3 + -1] = (xmlNodePtr)0x0;
      return pxVar2;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
nodePop(xmlParserCtxtPtr ctxt)
{
    xmlNodePtr ret;

    if (ctxt == NULL) return(NULL);
    if (ctxt->nodeNr <= 0)
        return (NULL);
    ctxt->nodeNr--;
    if (ctxt->nodeNr > 0)
        ctxt->node = ctxt->nodeTab[ctxt->nodeNr - 1];
    else
        ctxt->node = NULL;
    ret = ctxt->nodeTab[ctxt->nodeNr];
    ctxt->nodeTab[ctxt->nodeNr] = NULL;
    return (ret);
}